

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_sign.c
# Opt level: O0

err_t bignSign2(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
               octet *privkey,void *t,size_t t_len)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *d_00;
  u64 *dest;
  word wVar5;
  long in_RCX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  size_t in_stack_00000010;
  octet *stack;
  octet *hash_state;
  word *s1;
  word *s0;
  word *R;
  word *k;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  size_t no;
  err_t code;
  void *in_stack_ffffffffffffff48;
  bign_params *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  word *mod;
  octet *in_stack_ffffffffffffff60;
  word *b;
  char *in_stack_ffffffffffffff68;
  u64 *a;
  word *c;
  word *b_00;
  bign_params *in_stack_ffffffffffffff80;
  word *n_00;
  void *in_stack_ffffffffffffff88;
  word *a_00;
  word *a_01;
  bign_deep_i in_stack_ffffffffffffff98;
  word *a_02;
  size_t in_stack_ffffffffffffffa0;
  ec_o *ec_00;
  word *a_03;
  word *b_01;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    return 0x6d;
  }
  bVar1 = bignIsOperable(in_stack_ffffffffffffff50);
  if (bVar1 == 0) {
    return 0x1f6;
  }
  if ((in_RCX == -1) ||
     (sVar4 = oidFromDER(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58), sVar4 == 0xffffffffffffffff)) {
    return 0x12d;
  }
  if ((in_stack_00000008 != (void *)0x0) &&
     (bVar1 = memIsValid(in_stack_00000008,in_stack_00000010), bVar1 == 0)) {
    return 0x6d;
  }
  bignStart_keep(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  d_00 = (ec_o *)blobCreate((size_t)in_stack_ffffffffffffff48);
  if (d_00 == (ec_o *)0x0) {
    return 0x6e;
  }
  eVar2 = bignStart(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (eVar2 != 0) {
    blobClose((blob_t)0x152da2);
    return eVar2;
  }
  b_01 = (word *)d_00->f->no;
  a_03 = (word *)d_00->f->n;
  ec_00 = d_00;
  bVar1 = memIsValid(in_R8,(size_t)b_01);
  if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R9,(size_t)b_01), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,(long)b_01 + ((ulong)b_01 >> 1)), bVar1 != 0)) &&
     (bVar1 = memIsDisjoint2(in_R8,(size_t)b_01,in_RDI,(long)b_01 + ((ulong)b_01 >> 1)), bVar1 != 0)
     ) {
    b_00 = (word *)((long)&(d_00->hdr).keep + (d_00->hdr).keep);
    a_01 = b_00 + (long)a_03;
    a_00 = a_01 + (long)a_03;
    n_00 = a_00 + (long)a_03 + ((ulong)a_03 >> 1);
    b = a_00 + (long)a_03 * 2;
    mod = b;
    a_02 = b_00;
    sVar4 = beltHash_keep();
    dest = (u64 *)((long)b + sVar4);
    u64From(&in_stack_ffffffffffffff50->l,in_stack_ffffffffffffff48,0x152f32);
    bVar1 = wwIsZero(a_02,(size_t)a_03);
    if ((bVar1 == 0) && (iVar3 = wwCmp(a_02,d_00->order,(size_t)a_03), iVar3 < 0)) {
      beltHashStart(in_stack_ffffffffffffff50);
      beltHashStepH(b,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      a = dest;
      c = mod;
      beltHash_keep();
      memCopy(dest,in_stack_ffffffffffffff48,0x152fce);
      beltHashStepH(b,(size_t)mod,dest);
      if (in_stack_00000008 != (void *)0x0) {
        beltHashStepH(b,(size_t)mod,dest);
      }
      beltHashStepG((octet *)dest,in_stack_ffffffffffffff48);
      beltWBLStart(b,(octet *)mod,(size_t)dest);
      memCopy(dest,in_stack_ffffffffffffff48,0x153044);
      while( true ) {
        beltWBLStepE(b,(size_t)mod,dest);
        u64From(dest,in_stack_ffffffffffffff48,0x15306c);
        bVar1 = wwIsZero(a_01,(size_t)a_03);
        if ((bVar1 == 0) && (iVar3 = wwCmp(a_01,d_00->order,(size_t)a_03), iVar3 < 0)) break;
        u64To(dest,(size_t)in_stack_ffffffffffffff48,(u64 *)0x1530b3);
      }
      bVar1 = ecMulA(b_01,a_03,ec_00,(word *)d_00,(size_t)a_02,a_01);
      if (bVar1 == 0) {
        blobClose((blob_t)0x1530eb);
        local_4 = 0x1f6;
      }
      else {
        (*d_00->f->to)((octet *)a_00,a_00,d_00->f,a);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepG2((octet *)b,(size_t)mod,dest);
        u64From(dest,in_stack_ffffffffffffff48,0x153181);
        zzMul(a_01,a_00,(size_t)n_00,b_00,(size_t)c,a);
        wVar5 = zzAdd(a_00 + ((ulong)a_03 >> 1),a_00 + ((ulong)a_03 >> 1),a_02,(size_t)a_03);
        a_00[(long)a_03 + ((ulong)a_03 >> 1)] = wVar5;
        zzMod(a_03,(word *)ec_00,(size_t)d_00,a_02,(size_t)a_01,a_00);
        zzSubMod(c,a,b,mod,(size_t)dest);
        u64From(dest,in_stack_ffffffffffffff48,0x153269);
        zzSubMod(c,a,b,mod,(size_t)dest);
        u64To(dest,(size_t)in_stack_ffffffffffffff48,(u64 *)0x1532ad);
        blobClose((blob_t)0x1532b7);
        local_4 = 0;
      }
      return local_4;
    }
    blobClose((blob_t)0x152f6d);
    return 0x1f8;
  }
  blobClose((blob_t)0x152e69);
  return 0x6d;
}

Assistant:

err_t bignSign2(octet sig[], const bign_params* params, const octet oid_der[],
	size_t oid_len, const octet hash[], const octet privkey[], const void* t, 
	size_t t_len)
{
	err_t code;
	size_t no, n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [n/2] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить t
	if (!memIsNullOrValid(t, t_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bignSign2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	no  = ec->f->no;
	n = ec->f->n;
	ASSERT(n % 2 == 0);
	// проверить входные указатели
	if (!memIsValid(hash, no) ||
		!memIsValid(privkey, no) ||
		!memIsValid(sig, no + no / 2) ||
		!memIsDisjoint2(hash, no, sig, no + no / 2))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + n / 2;
	hash_state = (octet*)(R + 2 * n);
	stack = hash_state + beltHash_keep();
	// загрузить d
	wwFrom(d, privkey, no);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// хэшировать oid
	beltHashStart(hash_state);
	beltHashStepH(oid_der, oid_len, hash_state);
	// сгенерировать k по алгоритму 6.3.3
	{
		// theta <- belt-hash(oid || d || t)
		memCopy(stack, hash_state, beltHash_keep());
		beltHashStepH(privkey, no, stack);
		if (t != 0)
			beltHashStepH(t, t_len, stack);
		beltHashStepG(stack, stack);
		// инициализировать beltWBL ключом theta
		beltWBLStart(stack, stack, 32);
		// k <- H
		memCopy(k, hash, no);
		// k <- beltWBL(k, theta) пока k \notin {1,..., q - 1}
		while (1)
		{
			beltWBLStepE(k, no, stack);
			wwFrom(k, k, no);
			if (!wwIsZero(k, n) && wwCmp(k, ec->order, n) < 0)
				break;
			wwTo(k, no, k);
		}
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^l
	beltHashStepH(R, no, hash_state);
	beltHashStepH(hash, no, hash_state);
	beltHashStepG2(sig, no / 2, hash_state);
	wwFrom(s0, sig, no / 2);
	// R <- (s0 + 2^l) d
	zzMul(R, s0, n / 2, d, n, stack);
	R[n + n / 2] = zzAdd(R + n / 2, R + n / 2, d, n);
	// s1 <- R mod q
	zzMod(s1, R, n + n / 2 + 1, ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, no);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + no / 2, no, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}